

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer *ppbVar1;
  pointer pbVar2;
  InternalRunDeathTestFlag *pIVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  int *piVar9;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  __sighandler_t p_Var10;
  long *plVar11;
  _func_void *p_Var12;
  ulong *puVar13;
  ulong *puVar14;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ulong *extraout_RDX_00;
  ulong *extraout_RDX_01;
  ulong *extraout_RDX_02;
  ulong *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  pointer ppcVar17;
  pointer pbVar18;
  long lVar19;
  ulong uVar20;
  undefined8 uVar21;
  const_iterator __position;
  size_t __len;
  _union_1457 local_2f0;
  sigaction ignore_sigprof_action;
  string filter_flag;
  string internal_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  undefined1 local_180 [8];
  ExecDeathTestArgs args_2;
  int local_160;
  int local_15c;
  undefined1 auStack_158 [4];
  int death_test_index;
  Arguments args;
  int local_138;
  int local_134;
  int pipe_fd [2];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_15c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar5 = pipe(&local_138);
  if (iVar5 == -1) {
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_50 = (ulong *)*puVar8;
    puVar14 = puVar8 + 2;
    if (local_50 == puVar14) {
      local_40 = *puVar14;
      lStack_38 = puVar8[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *puVar14;
    }
    local_48 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = (ulong *)*plVar7;
    puVar14 = (ulong *)(plVar7 + 2);
    if (local_70 == puVar14) {
      local_60 = *puVar14;
      lStack_58 = plVar7[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *puVar14;
    }
    local_68 = plVar7[1];
    *plVar7 = (long)puVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_110._M_dataplus._M_p._0_4_ = 0x58c;
    StreamableToString<int>(&local_d0,(int *)&local_110);
    uVar20 = 0xf;
    if (local_70 != &local_60) {
      uVar20 = local_60;
    }
    if (uVar20 < local_d0._M_string_length + local_68) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar21 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_d0._M_string_length + local_68) goto LAB_00170c47;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_70);
    }
    else {
LAB_00170c47:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar8;
    puVar14 = puVar8 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar14) {
      local_b0.field_2._M_allocated_capacity = *puVar14;
      local_b0.field_2._8_8_ = puVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar14;
    }
    local_b0._M_string_length = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_2f0.sa_handler = (__sighandler_t)*plVar7;
    p_Var10 = (__sighandler_t)(plVar7 + 2);
    if (local_2f0.sa_handler == p_Var10) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
      ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
      local_2f0 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
    *plVar7 = (long)p_Var10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    internal_flag.field_2._8_8_ = *puVar8;
    puVar14 = puVar8 + 2;
    if ((ulong *)internal_flag.field_2._8_8_ == puVar14) {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
    }
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
    puVar8 = extraout_RAX_02;
    internal_flag.field_2._8_8_ = extraout_RDX_02;
LAB_00171655:
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
  }
  else {
    iVar5 = fcntl(local_134,2,0);
    if (iVar5 != -1) {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar14 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar14) {
        local_60 = *puVar14;
        lStack_58 = plVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar14;
        local_70 = (ulong *)*plVar7;
      }
      local_68 = plVar7[1];
      *plVar7 = (long)puVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar15 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_b0.field_2._M_allocated_capacity = *psVar15;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar15;
        local_b0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_2f0.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var10 = (__sighandler_t)(plVar7 + 2);
      if ((__sighandler_t)*plVar7 == p_Var10) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
        ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
        local_2f0.sa_handler = (__sighandler_t)*plVar7;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
      *plVar7 = (long)p_Var10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar11;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar7[3];
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar11;
        internal_flag.field_2._8_8_ = (long *)*plVar7;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(internal_flag.field_2._M_local_buf + 8);
      ignore_sigprof_action.sa_restorer = (_func_void *)&filter_flag._M_string_length;
      p_Var12 = (_func_void *)(plVar7 + 2);
      if ((_func_void *)*plVar7 == p_Var12) {
        filter_flag._M_string_length = *(size_type *)p_Var12;
        filter_flag.field_2._M_allocated_capacity = plVar7[3];
      }
      else {
        filter_flag._M_string_length = *(size_type *)p_Var12;
        ignore_sigprof_action.sa_restorer = (_func_void *)*plVar7;
      }
      filter_flag._M_dataplus._M_p = (pointer)plVar7[1];
      *plVar7 = (long)p_Var12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_2f0.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_2f0.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
      paVar16 = &local_110.field_2;
      puVar14 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_110.field_2._M_allocated_capacity = *puVar14;
        local_110.field_2._8_8_ = plVar7[3];
        local_110._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar14;
        local_110._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_110._M_string_length = plVar7[1];
      *plVar7 = (long)puVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
      puVar14 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_d0.field_2._M_allocated_capacity = *puVar14;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar14;
        local_d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)puVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
      puVar14 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar14) {
        local_80 = *puVar14;
        lStack_78 = plVar7[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar14;
        local_90 = (ulong *)*plVar7;
      }
      local_88 = plVar7[1];
      *plVar7 = (long)puVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      puVar14 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar14) {
        local_40 = *puVar14;
        lStack_38 = plVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *puVar14;
        local_50 = (ulong *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)puVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      StreamableToString<int>((string *)pipe_fd,&this->line_);
      uVar20 = 0xf;
      if (local_50 != &local_40) {
        uVar20 = local_40;
      }
      if (uVar20 < local_128 + local_48) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
          uVar21 = local_120._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_128 + local_48) goto LAB_0016f852;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)pipe_fd,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_0016f852:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_50,CONCAT44(pipe_fd[1],pipe_fd[0]));
      }
      local_70 = &local_60;
      puVar14 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar14) {
        local_60 = *puVar14;
        lStack_58 = puVar8[3];
      }
      else {
        local_60 = *puVar14;
        local_70 = (ulong *)*puVar8;
      }
      local_68 = puVar8[1];
      *puVar8 = puVar14;
      puVar8[1] = 0;
      *(undefined1 *)puVar14 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      puVar14 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_b0.field_2._M_allocated_capacity = *puVar14;
        local_b0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar14;
        local_b0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_b0._M_string_length = puVar8[1];
      *puVar8 = puVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      StreamableToString<int>((string *)auStack_158,&local_15c);
      uVar21 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar21 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 <
          (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start + local_b0._M_string_length)) {
        ppcVar17 = (pointer)0xf;
        if ((pointer *)_auStack_158 !=
            &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          ppcVar17 = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        if (ppcVar17 <
            (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start + local_b0._M_string_length))
        goto LAB_0016f97e;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)auStack_158,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      }
      else {
LAB_0016f97e:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,(ulong)_auStack_158);
      }
      local_2f0.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var10 = (__sighandler_t)(puVar8 + 2);
      if ((__sighandler_t)*puVar8 == p_Var10) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
        ignore_sigprof_action.sa_mask.__val[1] = puVar8[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
        local_2f0.sa_handler = (__sighandler_t)*puVar8;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(puVar8 + 1);
      *puVar8 = p_Var10;
      puVar8[1] = 0;
      *p_Var10 = (__sighandler_t)0x0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar11;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar7[3];
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar11;
        internal_flag.field_2._8_8_ = (long *)*plVar7;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      StreamableToString<int>((string *)local_180,&local_134);
      pbVar2 = (pointer)((long)&((args_1.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        CONCAT44(args_2.argv._4_4_,(int)args_2.argv));
      pbVar18 = (pointer)0xf;
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar18 = args_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (pbVar18 < pbVar2) {
        pbVar18 = (pointer)0xf;
        if (local_180 != (undefined1  [8])&args_2.close_fd) {
          pbVar18 = (pointer)args_2._8_8_;
        }
        if (pbVar18 < pbVar2) goto LAB_0016fabf;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)local_180,0,(char *)0x0,internal_flag.field_2._8_8_);
      }
      else {
LAB_0016fabf:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (internal_flag.field_2._M_local_buf + 8,(ulong)local_180);
      }
      filter_flag.field_2._8_8_ = &internal_flag._M_string_length;
      psVar15 = puVar8 + 2;
      if ((size_type *)*puVar8 == psVar15) {
        internal_flag._M_string_length = *psVar15;
        internal_flag.field_2._M_allocated_capacity = puVar8[3];
      }
      else {
        internal_flag._M_string_length = *psVar15;
        filter_flag.field_2._8_8_ = (size_type *)*puVar8;
      }
      internal_flag._M_dataplus._M_p = (pointer)puVar8[1];
      *puVar8 = psVar15;
      puVar8[1] = 0;
      *(undefined1 *)psVar15 = 0;
      if (local_180 != (undefined1  [8])&args_2.close_fd) {
        operator_delete((void *)local_180,args_2._8_8_ + 1);
      }
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_2f0.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_2f0.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if ((pointer *)_auStack_158 !=
          &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete(_auStack_158,
                        (long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                              .super__Vector_impl_data._M_finish + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(pipe_fd[1],pipe_fd[0]),local_120._M_allocated_capacity + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar16) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)auStack_158);
      GetInjectableArgvs_abi_cxx11_();
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)auStack_158,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&internal_flag.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&internal_flag.field_2 + 8));
      __position._M_current =
           args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      internal_flag.field_2._8_8_ = strdup((char *)ignore_sigprof_action.sa_restorer);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,__position,
                 (value_type *)((long)&internal_flag.field_2 + 8));
      ppbVar1 = &args_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      internal_flag.field_2._8_8_ = (size_type)strdup(filter_flag.field_2._8_8_);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,
                 (const_iterator)
                 (args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1),
                 (value_type *)((long)&internal_flag.field_2 + 8));
      internal_flag.field_2._8_8_ = ppbVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&internal_flag.field_2 + 8),"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((pointer *)internal_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_180 = (undefined1  [8])_auStack_158;
      args_2.argv._0_4_ = local_138;
      memset(&local_2f0,0,0x98);
      sigemptyset((sigset_t *)&ignore_sigprof_action);
      local_2f0 = (_union_1457)0x1;
      do {
        iVar5 = sigaction(0x1b,(sigaction *)&local_2f0,
                          (sigaction *)((long)&internal_flag.field_2 + 8));
        cVar4 = FLAGS_gtest_death_test_use_fork;
        if (iVar5 != -1) {
          iVar5 = -1;
          if (FLAGS_gtest_death_test_use_fork == '\0') {
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
              AssumeRole();
            }
            iVar5 = getpagesize();
            __len = (size_t)(iVar5 * 2);
            __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
            if (__addr == (void *)0xffffffffffffffff) {
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_110,"CHECK failed: File ","");
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
              local_d0._M_dataplus._M_p = (pointer)*puVar8;
              puVar14 = puVar8 + 2;
              if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
                local_d0.field_2._M_allocated_capacity = *puVar14;
                local_d0.field_2._8_8_ = puVar8[3];
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              }
              else {
                local_d0.field_2._M_allocated_capacity = *puVar14;
              }
              local_d0._M_string_length = puVar8[1];
              *puVar8 = puVar14;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
              local_90 = &local_80;
              puVar14 = (ulong *)*puVar8;
              puVar13 = puVar8 + 2;
              if (puVar14 != puVar13) goto LAB_00170f70;
              local_80 = *puVar13;
              lStack_78 = puVar8[3];
              goto LAB_00170f7e;
            }
            lVar19 = 0;
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
              lVar19 = __len - 0x40;
            }
            if ((0x40 < (uint)(iVar5 * 2)) && (((ulong)(lVar19 + (long)__addr) & 0x3f) == 0)) {
              iVar5 = clone(ExecDeathTestChildMain,(void *)(lVar19 + (long)__addr),0x11,local_180);
              iVar6 = munmap(__addr,__len);
              if (iVar6 != -1) goto LAB_0016ff1b;
              goto LAB_00170610;
            }
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,"CHECK failed: File ","");
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
            local_d0._M_dataplus._M_p = (pointer)*puVar8;
            puVar14 = puVar8 + 2;
            if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
              local_d0.field_2._M_allocated_capacity = *puVar14;
              local_d0.field_2._8_8_ = puVar8[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar14;
            }
            local_d0._M_string_length = puVar8[1];
            *puVar8 = puVar14;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            local_90 = (ulong *)*puVar8;
            puVar14 = puVar8 + 2;
            if (local_90 == puVar14) {
              local_80 = *puVar14;
              lStack_78 = puVar8[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *puVar14;
            }
            local_88 = puVar8[1];
            *puVar8 = puVar14;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            pipe_fd[0] = 0x563;
            StreamableToString<int>(&local_f0,pipe_fd);
            uVar20 = 0xf;
            if (local_90 != &local_80) {
              uVar20 = local_80;
            }
            if (uVar20 < local_f0._M_string_length + local_88) {
              uVar21 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                uVar21 = local_f0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < local_f0._M_string_length + local_88) goto LAB_001710a8;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_90)
              ;
            }
            else {
LAB_001710a8:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)local_f0._M_dataplus._M_p);
            }
            local_50 = (ulong *)*puVar8;
            puVar14 = puVar8 + 2;
            if (local_50 == puVar14) {
              local_40 = *puVar14;
              lStack_38 = puVar8[3];
              local_50 = &local_40;
            }
            else {
              local_40 = *puVar14;
            }
            local_48 = puVar8[1];
            *puVar8 = puVar14;
            puVar8[1] = 0;
            *(undefined1 *)puVar14 = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
            local_70 = (ulong *)*puVar8;
            puVar14 = puVar8 + 2;
            if (local_70 == puVar14) {
              local_60 = *puVar14;
              lStack_58 = puVar8[3];
              local_70 = &local_60;
            }
            else {
              local_60 = *puVar14;
            }
            local_68 = puVar8[1];
            *puVar8 = puVar14;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
            psVar15 = puVar8 + 2;
            if (paVar16 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) goto LAB_00171820;
            local_b0.field_2._M_allocated_capacity = *psVar15;
            local_b0.field_2._8_8_ = puVar8[3];
            goto LAB_00171831;
          }
LAB_0016ff1b:
          if ((cVar4 == '\0') || (iVar5 = fork(), iVar5 != 0)) {
            goto LAB_0016ff37;
          }
          ExecDeathTestChildMain(local_180);
LAB_00170610:
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"CHECK failed: File ","");
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
          local_d0._M_dataplus._M_p = (pointer)*puVar8;
          puVar14 = puVar8 + 2;
          if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
            local_d0.field_2._M_allocated_capacity = *puVar14;
            local_d0.field_2._8_8_ = puVar8[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *puVar14;
          }
          local_d0._M_string_length = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
          local_90 = (ulong *)*puVar8;
          puVar14 = puVar8 + 2;
          if (local_90 == puVar14) {
            local_80 = *puVar14;
            lStack_78 = puVar8[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *puVar14;
          }
          local_88 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          pipe_fd[0] = 0x567;
          StreamableToString<int>(&local_f0,pipe_fd);
          uVar20 = 0xf;
          if (local_90 != &local_80) {
            uVar20 = local_80;
          }
          if (uVar20 < local_f0._M_string_length + local_88) {
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              uVar21 = local_f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_f0._M_string_length + local_88) goto LAB_00171150;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_90);
          }
          else {
LAB_00171150:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)local_f0._M_dataplus._M_p);
          }
          local_50 = (ulong *)*puVar8;
          puVar14 = puVar8 + 2;
          if (local_50 == puVar14) {
            local_40 = *puVar14;
            lStack_38 = puVar8[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *puVar14;
          }
          local_48 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)puVar14 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
          local_70 = (ulong *)*puVar8;
          puVar14 = puVar8 + 2;
          if (local_70 == puVar14) {
            local_60 = *puVar14;
            lStack_58 = puVar8[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *puVar14;
          }
          local_68 = puVar8[1];
          *puVar8 = puVar14;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
          psVar15 = puVar8 + 2;
          if (paVar16 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) goto LAB_00171854;
          local_b0.field_2._M_allocated_capacity = *psVar15;
          local_b0.field_2._8_8_ = puVar8[3];
          goto LAB_00171865;
        }
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110._M_dataplus._M_p = (pointer)*plVar7;
      puVar14 = (ulong *)(plVar7 + 2);
      if ((ulong *)local_110._M_dataplus._M_p == puVar14) {
        local_110.field_2._M_allocated_capacity = *puVar14;
        local_110.field_2._8_8_ = plVar7[3];
        local_110._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar14;
      }
      local_110._M_string_length = plVar7[1];
      *plVar7 = (long)puVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
      puVar14 = (ulong *)(plVar7 + 2);
      if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
        local_d0.field_2._M_allocated_capacity = *puVar14;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar14;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)puVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_160 = 0x549;
      StreamableToString<int>((string *)pipe_fd,&local_160);
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar21 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_128 + local_d0._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
          uVar21 = local_120._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_128 + local_d0._M_string_length) goto LAB_00170296;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
      }
      else {
LAB_00170296:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_d0,CONCAT44(pipe_fd[1],pipe_fd[0]));
      }
      local_90 = (ulong *)*puVar8;
      puVar14 = puVar8 + 2;
      if (local_90 == puVar14) {
        local_80 = *puVar14;
        lStack_78 = puVar8[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar14;
      }
      local_88 = puVar8[1];
      *puVar8 = puVar14;
      puVar8[1] = 0;
      *(undefined1 *)puVar14 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_50 = (ulong *)*puVar8;
      puVar14 = puVar8 + 2;
      if (local_50 == puVar14) {
        local_40 = *puVar14;
        lStack_38 = puVar8[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *puVar14;
      }
      local_48 = puVar8[1];
      *puVar8 = puVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_70 = (ulong *)*puVar8;
      puVar14 = puVar8 + 2;
      if (local_70 == puVar14) {
        local_60 = *puVar14;
        lStack_58 = puVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar14;
      }
      local_68 = puVar8[1];
      *puVar8 = puVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      local_b0._M_dataplus._M_p = (pointer)*puVar8;
      puVar13 = puVar8 + 2;
      if ((ulong *)local_b0._M_dataplus._M_p == puVar13) {
        local_b0.field_2._M_allocated_capacity = *puVar13;
        local_b0.field_2._8_8_ = puVar8[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar13;
      }
      local_b0._M_string_length = puVar8[1];
      *puVar8 = puVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar8 = extraout_RAX;
      paVar16 = extraout_RDX;
      goto LAB_00170f08;
    }
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_50 = (ulong *)*puVar8;
    puVar14 = puVar8 + 2;
    if (local_50 == puVar14) {
      local_40 = *puVar14;
      lStack_38 = puVar8[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *puVar14;
    }
    local_48 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    local_70 = (ulong *)*puVar8;
    puVar14 = puVar8 + 2;
    if (local_70 == puVar14) {
      local_60 = *puVar14;
      lStack_58 = puVar8[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *puVar14;
    }
    local_68 = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_110._M_dataplus._M_p._0_4_ = 0x58f;
    StreamableToString<int>(&local_d0,(int *)&local_110);
    uVar20 = 0xf;
    if (local_70 != &local_60) {
      uVar20 = local_60;
    }
    if (uVar20 < local_d0._M_string_length + local_68) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar21 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_d0._M_string_length + local_68) goto LAB_00170cdf;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_70);
    }
    else {
LAB_00170cdf:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar8;
    puVar14 = puVar8 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar14) {
      local_b0.field_2._M_allocated_capacity = *puVar14;
      local_b0.field_2._8_8_ = puVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar14;
    }
    local_b0._M_string_length = puVar8[1];
    *puVar8 = puVar14;
    puVar8[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_2f0.sa_handler = (__sighandler_t)*plVar7;
    p_Var10 = (__sighandler_t)(plVar7 + 2);
    if (local_2f0.sa_handler == p_Var10) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
      ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
      local_2f0 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
    *plVar7 = (long)p_Var10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    internal_flag.field_2._8_8_ = *puVar8;
    puVar14 = puVar8 + 2;
    if ((ulong *)internal_flag.field_2._8_8_ != puVar14) goto LAB_00171655;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
    internal_flag.field_2._8_8_ =
         &args_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  }
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
  puVar8 = extraout_RAX_03;
  local_70 = extraout_RDX_03;
  goto LAB_00171689;
LAB_0016ffc9:
  do {
    iVar6 = close(local_134);
    if (iVar6 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar5;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_138;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)auStack_158);
      if ((size_type *)filter_flag.field_2._8_8_ != &internal_flag._M_string_length) {
        operator_delete((void *)filter_flag.field_2._8_8_,internal_flag._M_string_length + 1);
      }
      if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
        operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
      }
      return OVERSEE_TEST;
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
  local_90 = (ulong *)*puVar8;
  puVar14 = puVar8 + 2;
  if (local_90 == puVar14) {
    local_80 = *puVar14;
    lStack_78 = puVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar14;
  }
  local_88 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_50 = (ulong *)*plVar7;
  puVar14 = (ulong *)(plVar7 + 2);
  if (local_50 == puVar14) {
    local_40 = *puVar14;
    lStack_38 = plVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar14;
  }
  local_48 = plVar7[1];
  *plVar7 = (long)puVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_f0._M_dataplus._M_p._0_4_ = 0x5a6;
  StreamableToString<int>(&local_110,(int *)&local_f0);
  uVar20 = 0xf;
  if (local_50 != &local_40) {
    uVar20 = local_40;
  }
  if (uVar20 < local_110._M_string_length + local_48) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar21 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_110._M_string_length + local_48) goto LAB_001703ef;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_001703ef:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_110._M_dataplus._M_p);
  }
  local_70 = (ulong *)*puVar8;
  puVar14 = puVar8 + 2;
  if (local_70 == puVar14) {
    local_60 = *puVar14;
    lStack_58 = puVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar14;
  }
  local_68 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)puVar14 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
  local_b0._M_dataplus._M_p = (pointer)*puVar8;
  puVar14 = puVar8 + 2;
  if ((ulong *)local_b0._M_dataplus._M_p == puVar14) {
    local_b0.field_2._M_allocated_capacity = *puVar14;
    local_b0.field_2._8_8_ = puVar8[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *puVar14;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_2f0.sa_handler = (__sighandler_t)*plVar7;
  p_Var10 = (__sighandler_t)(plVar7 + 2);
  if (local_2f0.sa_handler == p_Var10) {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
    ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
    local_2f0 = (_union_1457)&ignore_sigprof_action.sa_mask;
  }
  else {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
  }
  ignore_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
  *plVar7 = (long)p_Var10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  internal_flag.field_2._8_8_ =
       &args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  puVar14 = (ulong *)*puVar8;
  puVar13 = puVar8 + 2;
  if (puVar14 != puVar13) goto LAB_00170f3c;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar13;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
  goto LAB_00170f4d;
  while (piVar9 = __errno_location(), *piVar9 == 4) {
LAB_0016ff37:
    iVar6 = sigaction(0x1b,(sigaction *)((long)&internal_flag.field_2 + 8),(sigaction *)0x0);
    if (iVar6 != -1) {
      if (iVar5 != -1) goto LAB_0016ffc9;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","")
      ;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      local_d0._M_dataplus._M_p = (pointer)*puVar8;
      puVar14 = puVar8 + 2;
      if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
        local_d0.field_2._M_allocated_capacity = *puVar14;
        local_d0.field_2._8_8_ = puVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar14;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = puVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      local_90 = (ulong *)*puVar8;
      puVar14 = puVar8 + 2;
      if (local_90 == puVar14) {
        local_80 = *puVar14;
        lStack_78 = puVar8[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar14;
      }
      local_88 = puVar8[1];
      *puVar8 = puVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      pipe_fd[0] = 0x577;
      StreamableToString<int>(&local_f0,pipe_fd);
      uVar20 = 0xf;
      if (local_90 != &local_80) {
        uVar20 = local_80;
      }
      if (uVar20 < local_f0._M_string_length + local_88) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          uVar21 = local_f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_f0._M_string_length + local_88) goto LAB_00170ebc;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_90);
      }
      else {
LAB_00170ebc:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_f0._M_dataplus._M_p)
        ;
      }
      local_50 = (ulong *)*puVar8;
      puVar14 = puVar8 + 2;
      if (local_50 == puVar14) {
        local_40 = *puVar14;
        lStack_38 = puVar8[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *puVar14;
      }
      local_48 = puVar8[1];
      *puVar8 = puVar14;
      puVar8[1] = 0;
      *(undefined1 *)puVar14 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70 = (ulong *)*plVar7;
      puVar14 = (ulong *)(plVar7 + 2);
      if (local_70 == puVar14) {
        local_60 = *puVar14;
        lStack_58 = plVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar14;
      }
      local_68 = plVar7[1];
      *plVar7 = (long)puVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_b0._M_dataplus._M_p = (pointer)*plVar7;
      psVar15 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar15) {
        local_b0.field_2._M_allocated_capacity = *psVar15;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar15;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar8 = extraout_RAX_04;
      local_b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_001717ec;
    }
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
  local_110._M_dataplus._M_p = (pointer)*puVar8;
  puVar14 = puVar8 + 2;
  if ((ulong *)local_110._M_dataplus._M_p == puVar14) {
    local_110.field_2._M_allocated_capacity = *puVar14;
    local_110.field_2._8_8_ = puVar8[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *puVar14;
  }
  local_110._M_string_length = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  local_d0._M_dataplus._M_p = (pointer)*puVar8;
  puVar14 = puVar8 + 2;
  if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
    local_d0.field_2._M_allocated_capacity = *puVar14;
    local_d0.field_2._8_8_ = puVar8[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *puVar14;
  }
  local_d0._M_string_length = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_160 = 0x574;
  StreamableToString<int>((string *)pipe_fd,&local_160);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar21 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_128 + local_d0._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(pipe_fd[1],pipe_fd[0]) != &local_120) {
      uVar21 = local_120._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_128 + local_d0._M_string_length) goto LAB_0017034d;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
  }
  else {
LAB_0017034d:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,CONCAT44(pipe_fd[1],pipe_fd[0]));
  }
  local_90 = (ulong *)*puVar8;
  puVar14 = puVar8 + 2;
  if (local_90 == puVar14) {
    local_80 = *puVar14;
    lStack_78 = puVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar14;
  }
  local_88 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)puVar14 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_50 = (ulong *)*puVar8;
  puVar14 = puVar8 + 2;
  if (local_50 == puVar14) {
    local_40 = *puVar14;
    lStack_38 = puVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar14;
  }
  local_48 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (ulong *)*puVar8;
  puVar14 = puVar8 + 2;
  if (local_70 == puVar14) {
    local_60 = *puVar14;
    lStack_58 = puVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar14;
  }
  local_68 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8;
  puVar13 = puVar8 + 2;
  if (paVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_b0.field_2._M_allocated_capacity = *puVar13;
    local_b0.field_2._8_8_ = puVar8[3];
  }
  else {
LAB_00170f08:
    local_b0.field_2._M_allocated_capacity = *puVar13;
    local_b0._M_dataplus._M_p = (pointer)paVar16;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = puVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar8 = extraout_RAX_00;
  puVar14 = extraout_RDX_00;
LAB_00170f3c:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar13;
  internal_flag.field_2._8_8_ = puVar14;
LAB_00170f4d:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[1];
  *puVar8 = puVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
  puVar8 = extraout_RAX_01;
  puVar14 = extraout_RDX_01;
LAB_00170f70:
  local_80 = *puVar13;
  local_90 = puVar14;
LAB_00170f7e:
  local_88 = puVar8[1];
  *puVar8 = puVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  pipe_fd[0] = 0x555;
  StreamableToString<int>(&local_f0,pipe_fd);
  uVar20 = 0xf;
  if (local_90 != &local_80) {
    uVar20 = local_80;
  }
  if (uVar20 < local_f0._M_string_length + local_88) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar21 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_f0._M_string_length + local_88) goto LAB_00171000;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_00171000:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_f0._M_dataplus._M_p);
  }
  local_50 = (ulong *)*puVar8;
  puVar14 = puVar8 + 2;
  if (local_50 == puVar14) {
    local_40 = *puVar14;
    lStack_38 = puVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar14;
  }
  local_48 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)puVar14 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (ulong *)*puVar8;
  puVar14 = puVar8 + 2;
  if (local_70 == puVar14) {
    local_60 = *puVar14;
    lStack_58 = puVar8[3];
    local_70 = &local_60;
  }
  else {
LAB_00171689:
    local_60 = *puVar14;
  }
  local_68 = puVar8[1];
  *puVar8 = puVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
  local_b0._M_dataplus._M_p = (pointer)*puVar8;
  psVar15 = puVar8 + 2;
  if ((size_type *)local_b0._M_dataplus._M_p == psVar15) {
    local_b0.field_2._M_allocated_capacity = *psVar15;
    local_b0.field_2._8_8_ = puVar8[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
LAB_001717ec:
    local_b0.field_2._M_allocated_capacity = *psVar15;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = psVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar8 = extraout_RAX_05;
  paVar16 = extraout_RDX_05;
LAB_00171820:
  local_b0.field_2._M_allocated_capacity = *psVar15;
  local_b0._M_dataplus._M_p = (pointer)paVar16;
LAB_00171831:
  local_b0._M_string_length = puVar8[1];
  *puVar8 = psVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar8 = extraout_RAX_06;
  paVar16 = extraout_RDX_06;
LAB_00171854:
  local_b0.field_2._M_allocated_capacity = *psVar15;
  local_b0._M_dataplus._M_p = (pointer)paVar16;
LAB_00171865:
  local_b0._M_string_length = puVar8[1];
  *puVar8 = psVar15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)auStack_158);
  if ((size_type *)filter_flag.field_2._8_8_ != &internal_flag._M_string_length) {
    operator_delete((void *)filter_flag.field_2._8_8_,internal_flag._M_string_length + 1);
  }
  if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
    operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}